

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O3

OptionStatus
passLocalOptions(HighsLogOptions *report_log_options,HighsOptions *from_options,
                HighsOptions *to_options)

{
  HighsOptionType HVar1;
  HighsInt value_00;
  OptionRecordDouble *pOVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  OptionRecordString *pOVar5;
  OptionStatus OVar6;
  uint uVar7;
  ulong uVar8;
  string value;
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90 [16];
  _func_int *local_80;
  HighsOptions *local_78;
  string local_70;
  string local_50;
  
  local_80 = (_func_int *)
             ((ulong)((long)(to_options->records).
                            super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(to_options->records).
                           super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>.
                           _M_impl.super__Vector_impl_data._M_start) >> 3);
  uVar7 = (uint)local_80;
  if (0 < (int)uVar7) {
    uVar8 = 0;
    do {
      pOVar2 = (OptionRecordDouble *)
               (to_options->records).
               super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar8];
      HVar1 = (pOVar2->super_OptionRecord).type;
      if (HVar1 == kString) {
        pp_Var3 = (from_options->records).
                  super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar8][1]._vptr_OptionRecord;
        local_a0 = local_90;
        p_Var4 = *pp_Var3;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,p_Var4,pp_Var3[1] + (long)p_Var4);
        pOVar5 = (OptionRecordString *)
                 (to_options->records).
                 super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_a0,local_a0 + local_98);
        OVar6 = checkOptionValue(report_log_options,pOVar5,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0);
        }
joined_r0x0024f787:
        if (OVar6 != kOk) {
          return OVar6;
        }
      }
      else {
        if (HVar1 == kDouble) {
          OVar6 = checkOptionValue(report_log_options,pOVar2,
                                   (double)*(from_options->records).
                                            super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar8][1].
                                            _vptr_OptionRecord);
          goto joined_r0x0024f787;
        }
        if (HVar1 == kInt) {
          OVar6 = checkOptionValue(report_log_options,(OptionRecordInt *)pOVar2,
                                   *(HighsInt *)
                                    (from_options->records).
                                    super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start[uVar8][1].
                                    _vptr_OptionRecord);
          goto joined_r0x0024f787;
        }
      }
      uVar8 = uVar8 + 1;
    } while ((uVar7 & 0x7fffffff) != uVar8);
    uVar7 = (uint)local_80;
    if (0 < (int)uVar7) {
      uVar8 = 0;
      local_78 = to_options;
      do {
        pOVar2 = (OptionRecordDouble *)
                 (to_options->records).
                 super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar8];
        HVar1 = (pOVar2->super_OptionRecord).type;
        if (HVar1 == kDouble) {
          local_80 = *(from_options->records).
                      super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8][1]._vptr_OptionRecord;
          OVar6 = checkOptionValue(report_log_options,pOVar2,(double)local_80);
          if (OVar6 != kOk) {
            return OVar6;
          }
          *pOVar2->value = (double)local_80;
        }
        else if (HVar1 == kInt) {
          value_00 = *(HighsInt *)
                      (from_options->records).
                      super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar8][1]._vptr_OptionRecord;
          OVar6 = checkOptionValue(report_log_options,(OptionRecordInt *)pOVar2,value_00);
          if (OVar6 != kOk) {
            return OVar6;
          }
          *(HighsInt *)pOVar2->value = value_00;
          to_options = local_78;
        }
        else if (HVar1 == kBool) {
          *(undefined1 *)pOVar2->value =
               *(undefined1 *)
                (from_options->records).
                super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8][1]._vptr_OptionRecord;
        }
        else {
          pp_Var3 = (from_options->records).
                    super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar8][1]._vptr_OptionRecord;
          local_a0 = local_90;
          p_Var4 = *pp_Var3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,p_Var4,pp_Var3[1] + (long)p_Var4);
          pOVar5 = (OptionRecordString *)
                   (to_options->records).
                   super__Vector_base<OptionRecord_*,_std::allocator<OptionRecord_*>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,local_a0,local_a0 + local_98);
          OVar6 = setLocalOptionValue(report_log_options,pOVar5,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if (local_a0 != local_90) {
            operator_delete(local_a0);
          }
          if (OVar6 != kOk) {
            return OVar6;
          }
        }
        uVar8 = uVar8 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar8);
    }
  }
  return kOk;
}

Assistant:

OptionStatus passLocalOptions(const HighsLogOptions& report_log_options,
                              const HighsOptions& from_options,
                              HighsOptions& to_options) {
  // (Attempt to) set option value from the HighsOptions passed in
  OptionStatus return_status;
  //  std::string empty_file = "";
  //  std::string from_log_file = from_options.log_file;
  //  std::string original_to_log_file = to_options.log_file;
  //  FILE* original_to_log_stream =
  //  to_options.log_options.log_stream;
  HighsInt num_options = to_options.records.size();
  // Check all the option values before setting any of them - in case
  // to_options are the main Highs options. Checks are only needed for
  // HighsInt, double and string since bool values can't be illegal
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = to_options.records[index]->type;
    if (type == HighsOptionType::kInt) {
      HighsInt value =
          *(((OptionRecordInt*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options, ((OptionRecordInt*)to_options.records[index])[0],
          value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kDouble) {
      double value =
          *(((OptionRecordDouble*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options,
          ((OptionRecordDouble*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kString) {
      std::string value =
          *(((OptionRecordString*)from_options.records[index])[0].value);
      return_status = checkOptionValue(
          report_log_options,
          ((OptionRecordString*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    }
  }
  // Checked from_options and found it to be OK, so set all the values
  for (HighsInt index = 0; index < num_options; index++) {
    HighsOptionType type = to_options.records[index]->type;
    if (type == HighsOptionType::kBool) {
      bool value = *(((OptionRecordBool*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          ((OptionRecordBool*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kInt) {
      HighsInt value =
          *(((OptionRecordInt*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options, ((OptionRecordInt*)to_options.records[index])[0],
          value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else if (type == HighsOptionType::kDouble) {
      double value =
          *(((OptionRecordDouble*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options,
          ((OptionRecordDouble*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    } else {
      std::string value =
          *(((OptionRecordString*)from_options.records[index])[0].value);
      return_status = setLocalOptionValue(
          report_log_options,
          ((OptionRecordString*)to_options.records[index])[0], value);
      if (return_status != OptionStatus::kOk) return return_status;
    }
  }
  /*
  if (from_log_file.compare(original_to_log_file)) {
    // The log file name has changed
    if (from_options.log_options.log_stream &&
        !original_to_log_file.compare(empty_file)) {
      // The stream corresponding to from_log_file is non-null and the
      // original log file name was empty, so to_options inherits the
      // stream, but associated with the (necessarily) non-empty name
      // from_log_file
      //
      // This ensures that the stream to Highs.log opened in
      // RunHighs.cpp is retained unless the log file name is changed.
      assert(from_log_file.compare(empty_file));
      assert(!original_to_log_stream);
      to_options.log_options.log_stream =
          from_options.log_options.log_stream;
    } else {
      highsOpenLogFile(to_options, to_options.log_file);
    }
  }
  */
  return OptionStatus::kOk;
}